

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install.cpp
# Opt level: O0

string * duckdb::ExtensionHelper::DefaultExtensionFolder_abi_cxx11_(FileSystem *fs)

{
  byte bVar1;
  undefined8 uVar2;
  long *in_RSI;
  string *in_RDI;
  string home_directory;
  string *res;
  allocator local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  IOException *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  FileSystem *in_stack_ffffffffffffff08;
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [38];
  undefined1 local_92;
  undefined1 local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [48];
  optional_ptr<duckdb::FileOpener,_true> local_38;
  string local_30 [32];
  long *local_10;
  
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0xb8))(local_30);
  optional_ptr<duckdb::FileOpener,_true>::optional_ptr(&local_38,(FileOpener *)0x0);
  bVar1 = (**(code **)(*local_10 + 0x68))(local_10,local_30,local_38.ptr);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    local_91 = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_68,
               "Can\'t find the home directory at \'%s\'\nSpecify a home directory using the SET home_directory=\'/path/to/dir\' option."
               ,&local_69);
    ::std::__cxx11::string::string(local_90,local_30);
    IOException::IOException<std::__cxx11::string>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    local_91 = 0;
    __cxa_throw(uVar2,&IOException::typeinfo,IOException::~IOException);
  }
  local_92 = 0;
  ::std::__cxx11::string::string((string *)in_RDI,local_30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_d8,".duckdb",&local_d9);
  FileSystem::JoinPath
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  ::std::__cxx11::string::operator=((string *)in_RDI,local_b8);
  ::std::__cxx11::string::~string(local_b8);
  ::std::__cxx11::string::~string(local_d8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffee0,"extensions",&local_121);
  FileSystem::JoinPath
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  ::std::__cxx11::string::operator=((string *)in_RDI,(string *)&stack0xffffffffffffff00);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_121);
  local_92 = 1;
  ::std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

duckdb::string ExtensionHelper::DefaultExtensionFolder(FileSystem &fs) {
	string home_directory = fs.GetHomeDirectory();
	// exception if the home directory does not exist, don't create whatever we think is home
	if (!fs.DirectoryExists(home_directory)) {
		throw IOException("Can't find the home directory at '%s'\nSpecify a home directory using the SET "
		                  "home_directory='/path/to/dir' option.",
		                  home_directory);
	}
	string res = home_directory;
	res = fs.JoinPath(res, ".duckdb");
	res = fs.JoinPath(res, "extensions");
	return res;
}